

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *__s;
  allocator<char> local_f9;
  text local_f8;
  text local_d8;
  comment local_b8;
  text local_98;
  text local_78;
  location local_48;
  text *local_20;
  text *test_local;
  message *e_local;
  ostream *os_local;
  
  local_20 = test;
  test_local = (text *)e;
  e_local = (message *)os;
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string
            ((string *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &test_local->field_2);
  colourise(&local_78,&local_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  comment::comment(&local_b8,(comment *)((long)&test_local[2].field_2 + 8));
  poVar1 = operator<<(poVar1,&local_b8);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  __s = (char *)(**(code **)((test_local->_M_dataplus)._M_p + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,__s,&local_f9);
  colourise(&local_d8,&local_f8);
  poVar1 = std::operator<<(poVar1,(string *)&local_d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  comment::~comment(&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  location::~location(&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}